

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *p;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  abctime aVar5;
  bool bVar6;
  abctime clk;
  int CounterPi1;
  int CounterPi0;
  int Counter1;
  int Counter0;
  int Count;
  int Lit;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSuperGate;
  Vec_Int_t *vCountLits;
  Vec_Int_t *vResult;
  int nImpLimit;
  Gia_Man_t *pGia_local;
  
  CounterPi0 = 0;
  CounterPi1 = 0;
  clk._4_4_ = 0;
  clk._0_4_ = 0;
  aVar2 = Abc_Clock();
  iVar1 = Gia_ManObjNum(pGia);
  p = Vec_IntStart(iVar1 << 1);
  pVVar3 = Vec_IntAlloc(1000);
  Lit = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(pGia);
    bVar6 = false;
    if (Lit < iVar1) {
      iVar1 = Gia_ManPoNum(pGia);
      _k = Gia_ManCo(pGia,iVar1 + Lit);
      bVar6 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFaninId0p(pGia,_k);
    if (iVar1 != 0) {
      pGVar4 = Gia_ObjChild0(_k);
      iVar1 = Gia_ObjToLit(pGia,pGVar4);
      Vec_IntAddToEntry(p,iVar1,1);
      pGVar4 = Gia_ObjFanin0(_k);
      Gia_ManSimCollect(pGia,pGVar4,pVVar3);
      for (Count = 0; iVar1 = Vec_IntSize(pVVar3), Count < iVar1; Count = Count + 1) {
        iVar1 = Vec_IntEntry(pVVar3,Count);
        Vec_IntAddToEntry(p,iVar1,1);
      }
    }
    Lit = Lit + 1;
  }
  Vec_IntFree(pVVar3);
  iVar1 = Gia_ManObjNum(pGia);
  pVVar3 = Vec_IntStartFull(iVar1);
  for (Counter0 = 0; iVar1 = Vec_IntSize(p), Counter0 < iVar1; Counter0 = Counter0 + 1) {
    iVar1 = Vec_IntEntry(p,Counter0);
    if (4 < iVar1) {
      iVar1 = Abc_Lit2Var(Counter0);
      pGVar4 = Gia_ManObj(pGia,iVar1);
      iVar1 = Abc_LitIsCompl(Counter0);
      if (iVar1 == 0) {
        iVar1 = Abc_Lit2Var(Counter0);
        Vec_IntWriteEntry(pVVar3,iVar1,1);
        iVar1 = Gia_ObjIsPi(pGia,pGVar4);
        clk._0_4_ = iVar1 + (uint)clk;
        CounterPi1 = CounterPi1 + 1;
      }
      else {
        iVar1 = Abc_Lit2Var(Counter0);
        Vec_IntWriteEntry(pVVar3,iVar1,0);
        iVar1 = Gia_ObjIsPi(pGia,pGVar4);
        clk._4_4_ = iVar1 + clk._4_4_;
        CounterPi0 = CounterPi0 + 1;
      }
    }
  }
  Vec_IntFree(p);
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",(ulong)(uint)CounterPi0,(ulong)clk._4_4_,
         (ulong)(uint)CounterPi1,(ulong)(uint)clk);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar2);
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}